

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

size_t create_circuit(ect *e,uint64_t max_label,uint64_t eliminations)

{
  v_array<v_array<v_array<unsigned_int>_>_> *this;
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  direction *pdVar4;
  v_array<v_array<unsigned_int>_> tournaments_00;
  undefined8 uVar5;
  undefined8 uVar6;
  ect *peVar7;
  ect *peVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  v_array<unsigned_int> *pvVar12;
  size_t sVar13;
  size_t t_1;
  uint64_t uVar14;
  v_array<v_array<unsigned_int>_> *pvVar15;
  ulong uVar16;
  ulong uVar17;
  uint32_t *new_ele;
  v_array<direction> *this_00;
  uint *puVar18;
  long lVar19;
  uint32_t id;
  v_array<direction> *local_120;
  ulong local_118;
  ect *local_110;
  v_array<v_array<unsigned_int>_> tournaments;
  uint local_dc;
  v_array<unsigned_int> empty;
  v_array<v_array<unsigned_int>_> new_tournaments;
  v_array<unsigned_int> t;
  
  uVar16 = 0;
  if (max_label != 1) {
    tournaments.end_array = (v_array<unsigned_int> *)0x0;
    tournaments.erase_count = 0;
    tournaments._begin = (v_array<unsigned_int> *)0x0;
    tournaments._end = (v_array<unsigned_int> *)0x0;
    t.end_array = (uint *)0x0;
    t.erase_count = 0;
    t._begin = (uint *)0x0;
    t._end = (uint *)0x0;
    local_120 = &e->directions;
    local_110 = e;
    while (new_tournaments._begin =
                (v_array<unsigned_int> *)CONCAT44(new_tournaments._begin._4_4_,(int)uVar16),
          uVar16 < max_label) {
      v_array<unsigned_int>::push_back(&t,(uint *)&new_tournaments);
      empty.erase_count = 0;
      empty._end = (uint *)0x0;
      empty.end_array = (uint *)0x0;
      empty._begin = (uint *)((ulong)new_tournaments._begin & 0xffffffff);
      v_array<direction>::push_back(local_120,(direction *)&empty);
      uVar16 = (ulong)((int)new_tournaments._begin + 1);
    }
    v_array<v_array<unsigned_int>_>::push_back(&tournaments,&t);
    for (uVar14 = 1; peVar7 = local_110, eliminations != uVar14; uVar14 = uVar14 + 1) {
      empty.end_array = (uint *)0x0;
      empty.erase_count = 0;
      empty._begin = (uint *)0x0;
      empty._end = (uint *)0x0;
      v_array<v_array<unsigned_int>_>::push_back(&tournaments,&empty);
    }
    this = &local_110->all_levels;
    v_array<v_array<v_array<unsigned_int>_>_>::push_back(this,&tournaments);
    local_118 = ((long)(peVar7->directions)._end - (long)(peVar7->directions)._begin) / 0x28;
    lVar19 = 0;
    while( true ) {
      pvVar15 = this->_begin;
      uVar5 = pvVar15[lVar19]._begin;
      uVar6 = pvVar15[lVar19]._end;
      tournaments_00._end = (v_array<unsigned_int> *)uVar6;
      tournaments_00._begin = (v_array<unsigned_int> *)uVar5;
      tournaments_00.end_array = pvVar15[lVar19].end_array;
      tournaments_00.erase_count = (size_t)(&pvVar15[lVar19].end_array)[1];
      bVar9 = not_empty(tournaments_00);
      peVar8 = local_110;
      if (!bVar9) break;
      pvVar15 = pvVar15 + lVar19;
      new_tournaments.end_array = (v_array<unsigned_int> *)0x0;
      new_tournaments.erase_count = 0;
      new_tournaments._begin = (v_array<unsigned_int> *)0x0;
      new_tournaments._end = (v_array<unsigned_int> *)0x0;
      tournaments._begin = pvVar15->_begin;
      tournaments._end = pvVar15->_end;
      tournaments.end_array = pvVar15->end_array;
      tournaments.erase_count = pvVar15->erase_count;
      uVar16 = 0;
      while( true ) {
        if ((ulong)((long)tournaments._end - (long)tournaments._begin >> 5) <= uVar16) break;
        empty.end_array = (uint *)0x0;
        empty.erase_count = 0;
        empty._begin = (uint *)0x0;
        empty._end = (uint *)0x0;
        v_array<v_array<unsigned_int>_>::push_back(&new_tournaments,&empty);
        uVar16 = uVar16 + 1;
      }
      pvVar12 = tournaments._begin;
      this_00 = local_120;
      puVar18 = (uint *)0x0;
      while (puVar18 < (uint *)((long)tournaments._end - (long)pvVar12 >> 5)) {
        puVar1 = (uint *)((long)puVar18 + 1);
        local_118 = local_118 & 0xffffffff;
        uVar16 = 0;
        while( true ) {
          puVar3 = pvVar12[(long)puVar18]._begin;
          uVar17 = (long)pvVar12[(long)puVar18]._end - (long)puVar3;
          if ((ulong)((long)uVar17 >> 2) >> 1 <= uVar16) break;
          id = (int)local_118 + (int)uVar16;
          uVar11 = puVar3[uVar16 * 2];
          uVar2 = puVar3[uVar16 * 2 + 1];
          empty._begin = (uint *)(ulong)id;
          empty.end_array = (uint *)0x0;
          empty.erase_count = CONCAT44(uVar2,uVar11);
          empty._end = puVar18;
          v_array<direction>::push_back(this_00,(direction *)&empty);
          pdVar4 = (local_110->directions)._begin;
          uVar10 = (int)(((long)(local_110->directions)._end - (long)pdVar4) / 0x28) - 1;
          if ((uint *)pdVar4[uVar11].tournament == puVar18) {
            pdVar4[uVar11].winner = uVar10;
          }
          else {
            pdVar4[uVar11].loser = uVar10;
          }
          pdVar4 = local_120->_begin;
          if ((uint *)pdVar4[uVar2].tournament == puVar18) {
            pdVar4[uVar2].winner = uVar10;
          }
          else {
            pdVar4[uVar2].loser = uVar10;
          }
          if (local_120->_begin[uVar11].last == true) {
            local_120->_begin[uVar11].winner = uVar10;
          }
          if (((long)tournaments._begin[(long)puVar18]._end -
               (long)tournaments._begin[(long)puVar18]._begin == 8) &&
             ((puVar18 == (uint *)0x0 ||
              (tournaments._begin[(long)puVar18 - 1]._end ==
               tournaments._begin[(long)puVar18 - 1]._begin)))) {
            local_120->_begin[uVar10].last = true;
            if (puVar1 < (uint *)((long)tournaments._end - (long)tournaments._begin >> 5)) {
              v_array<unsigned_int>::push_back(new_tournaments._begin + (long)puVar1,&id);
            }
            else {
              local_120->_begin[uVar10].winner = 0;
            }
            local_dc = (int)(((long)(local_110->directions)._end -
                             (long)(local_110->directions)._begin) / 0x28) - 1;
            new_ele = &local_dc;
            pvVar12 = &peVar7->final_nodes;
          }
          else {
            new_ele = &id;
            pvVar12 = new_tournaments._begin + (long)puVar18;
          }
          v_array<unsigned_int>::push_back(pvVar12,new_ele);
          if (puVar1 < (uint *)((long)tournaments._end - (long)tournaments._begin >> 5)) {
            v_array<unsigned_int>::push_back(new_tournaments._begin + (long)puVar1,&id);
          }
          else {
            local_120->_begin[uVar10].loser = 0;
          }
          uVar16 = uVar16 + 1;
          pvVar12 = tournaments._begin;
          this_00 = local_120;
        }
        if ((uVar17 & 4) != 0) {
          empty._begin = (uint *)CONCAT44(empty._begin._4_4_,pvVar12[(long)puVar18]._end[-1]);
          v_array<unsigned_int>::push_back(new_tournaments._begin + (long)puVar18,(uint *)&empty);
          pvVar12 = tournaments._begin;
          this_00 = local_120;
        }
        local_118 = local_118 + uVar16;
        puVar18 = puVar1;
      }
      v_array<v_array<v_array<unsigned_int>_>_>::push_back(this,&new_tournaments);
      lVar19 = lVar19 + 1;
    }
    uVar11 = (int)eliminations * ((int)max_label + -1);
    local_110->last_pair = uVar11;
    if (max_label != 0) {
      sVar13 = final_depth(eliminations);
      peVar8->tree_height = sVar13;
      uVar11 = peVar8->last_pair;
    }
    uVar16 = (eliminations - 1) + (ulong)uVar11;
  }
  return uVar16;
}

Assistant:

size_t create_circuit(ect& e, uint64_t max_label, uint64_t eliminations)
{
  if (max_label == 1)
    return 0;

  v_array<v_array<uint32_t>> tournaments = v_init<v_array<uint32_t>>();
  v_array<uint32_t> t = v_init<uint32_t>();

  for (uint32_t i = 0; i < max_label; i++)
  {
    t.push_back(i);
    direction d = {i, 0, 0, 0, 0, 0, false};
    e.directions.push_back(d);
  }

  tournaments.push_back(t);

  for (size_t i = 0; i < eliminations - 1; i++) tournaments.push_back(v_array<uint32_t>());

  e.all_levels.push_back(tournaments);

  size_t level = 0;

  uint32_t node = (uint32_t)e.directions.size();

  while (not_empty(e.all_levels[level]))
  {
    v_array<v_array<uint32_t>> new_tournaments = v_init<v_array<uint32_t>>();
    tournaments = e.all_levels[level];

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      v_array<uint32_t> empty = v_init<uint32_t>();
      new_tournaments.push_back(empty);
    }

    for (size_t t = 0; t < tournaments.size(); t++)
    {
      for (size_t j = 0; j < tournaments[t].size() / 2; j++)
      {
        uint32_t id = node++;
        uint32_t left = tournaments[t][2 * j];
        uint32_t right = tournaments[t][2 * j + 1];

        direction d = {id, t, 0, 0, left, right, false};
        e.directions.push_back(d);
        uint32_t direction_index = (uint32_t)e.directions.size() - 1;
        if (e.directions[left].tournament == t)
          e.directions[left].winner = direction_index;
        else
          e.directions[left].loser = direction_index;
        if (e.directions[right].tournament == t)
          e.directions[right].winner = direction_index;
        else
          e.directions[right].loser = direction_index;
        if (e.directions[left].last == true)
          e.directions[left].winner = direction_index;

        if (tournaments[t].size() == 2 && (t == 0 || tournaments[t - 1].size() == 0))
        {
          e.directions[direction_index].last = true;
          if (t + 1 < tournaments.size())
            new_tournaments[t + 1].push_back(id);
          else  // winner eliminated.
            e.directions[direction_index].winner = 0;
          e.final_nodes.push_back((uint32_t)(e.directions.size() - 1));
        }
        else
          new_tournaments[t].push_back(id);
        if (t + 1 < tournaments.size())
          new_tournaments[t + 1].push_back(id);
        else  // loser eliminated.
          e.directions[direction_index].loser = 0;
      }
      if (tournaments[t].size() % 2 == 1)
        new_tournaments[t].push_back(tournaments[t].last());
    }
    e.all_levels.push_back(new_tournaments);
    level++;
  }

  e.last_pair = (uint32_t)((max_label - 1) * eliminations);

  if (max_label > 1)
    e.tree_height = final_depth(eliminations);

  return e.last_pair + (eliminations - 1);
}